

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_expanded_expression.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundExpandedExpression::Copy(BoundExpandedExpression *this)

{
  string *msg;
  allocator *this_00;
  allocator local_31;
  string local_30 [48];
  
  msg = (string *)__cxa_allocate_exception(0x10);
  this_00 = &local_31;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"Cannot copy BoundExpandedExpression",this_00);
  SerializationException::SerializationException((SerializationException *)this_00,msg);
  __cxa_throw(msg,&SerializationException::typeinfo,SerializationException::~SerializationException)
  ;
}

Assistant:

unique_ptr<Expression> BoundExpandedExpression::Copy() const {
	throw SerializationException("Cannot copy BoundExpandedExpression");
}